

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::BufferViewCreateInfo::BufferViewCreateInfo
          (BufferViewCreateInfo *this,VkBuffer _buffer,VkFormat _format,VkDeviceSize _offset,
          VkDeviceSize _range)

{
  (this->super_VkBufferViewCreateInfo).sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  (this->super_VkBufferViewCreateInfo).pNext = (void *)0x0;
  (this->super_VkBufferViewCreateInfo).flags = 0;
  (this->super_VkBufferViewCreateInfo).buffer.m_internal = _buffer.m_internal;
  (this->super_VkBufferViewCreateInfo).format = _format;
  (this->super_VkBufferViewCreateInfo).offset = _offset;
  (this->super_VkBufferViewCreateInfo).range = _range;
  return;
}

Assistant:

BufferViewCreateInfo::BufferViewCreateInfo (vk::VkBuffer	_buffer,
											vk::VkFormat		_format,
											vk::VkDeviceSize _offset,
											vk::VkDeviceSize _range)
{
	sType = vk::VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
	pNext = DE_NULL;

	flags	= 0;
	buffer	= _buffer;
	format	= _format;
	offset	= _offset;
	range	= _range;
}